

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  value_type pMVar1;
  unsigned_long uVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  bool bVar6;
  Flags FVar7;
  size_t sVar8;
  size_t sVar9;
  byte *pbVar10;
  char *pcVar11;
  reference pvVar12;
  MatchResultListener *pMVar13;
  const_reference ppMVar14;
  ostream *poVar15;
  size_type sVar16;
  const_reference x;
  bool local_d9;
  unsigned_long local_d0;
  size_t ei;
  char *outer_sep;
  char *sep_1;
  size_t mi;
  char *sep;
  ulong uStack_a0;
  char matched;
  size_t irhs;
  size_t ilhs;
  undefined1 local_88 [8];
  vector<char,_std::allocator<char>_> matcher_matched;
  undefined1 local_68 [8];
  vector<char,_std::allocator<char>_> element_matched;
  bool result;
  Message local_40;
  bool local_31;
  MatchResultListener *pMStack_30;
  bool is_exact_match_with_size_discrepency;
  MatchResultListener *listener_local;
  MatchMatrix *matrix_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *element_printouts_local;
  UnorderedElementsAreMatcherImplBase *this_local;
  
  pMStack_30 = listener;
  listener_local = (MatchResultListener *)matrix;
  matrix_local = (MatchMatrix *)element_printouts;
  element_printouts_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  sVar8 = MatchMatrix::LhsSize(matrix);
  if ((sVar8 == 0) && (sVar8 = MatchMatrix::RhsSize((MatchMatrix *)listener_local), sVar8 == 0)) {
    this_local._7_1_ = 1;
  }
  else {
    FVar7 = match_flags(this);
    local_d9 = false;
    if (FVar7 == ExactMatch) {
      sVar8 = MatchMatrix::LhsSize((MatchMatrix *)listener_local);
      sVar9 = MatchMatrix::RhsSize((MatchMatrix *)listener_local);
      local_d9 = sVar8 != sVar9;
    }
    local_31 = local_d9;
    if (((local_d9 != false) &&
        (sVar8 = MatchMatrix::LhsSize((MatchMatrix *)listener_local), sVar8 != 0)) &&
       (bVar6 = MatchResultListener::IsInterested(pMStack_30), bVar6)) {
      pMVar13 = MatchResultListener::operator<<(pMStack_30,(char (*) [11])"which has ");
      sVar8 = MatchMatrix::LhsSize((MatchMatrix *)listener_local);
      Elements((UnorderedElementsAreMatcherImplBase *)&local_40,sVar8);
      pMVar13 = MatchResultListener::operator<<(pMVar13,&local_40);
      MatchResultListener::operator<<(pMVar13,(char (*) [2])0x189b52);
      Message::~Message(&local_40);
    }
    element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ = ~local_31 & 1;
    sVar8 = MatchMatrix::LhsSize((MatchMatrix *)listener_local);
    matcher_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_68,sVar8,
               &matcher_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17,
               (allocator_type *)
               &matcher_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &matcher_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
    sVar8 = MatchMatrix::RhsSize((MatchMatrix *)listener_local);
    ilhs._7_1_ = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_88,sVar8,(value_type *)((long)&ilhs + 7)
               ,(allocator_type *)((long)&ilhs + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&ilhs + 6));
    for (irhs = 0; sVar8 = irhs, sVar9 = MatchMatrix::LhsSize((MatchMatrix *)listener_local),
        sVar8 < sVar9; irhs = irhs + 1) {
      for (uStack_a0 = 0; uVar5 = uStack_a0,
          sVar8 = MatchMatrix::RhsSize((MatchMatrix *)listener_local), uVar5 < sVar8;
          uStack_a0 = uStack_a0 + 1) {
        bVar6 = MatchMatrix::HasEdge((MatchMatrix *)listener_local,irhs,uStack_a0);
        sep._7_1_ = bVar6;
        pbVar10 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                                    ((vector<char,_std::allocator<char>_> *)local_68,irhs);
        bVar4 = sep._7_1_;
        *pbVar10 = *pbVar10 | bVar6;
        pbVar10 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                                    ((vector<char,_std::allocator<char>_> *)local_88,uStack_a0);
        *pbVar10 = *pbVar10 | bVar4;
      }
    }
    FVar7 = match_flags(this);
    if ((FVar7 & Superset) != 0) {
      mi = (size_t)anon_var_dwarf_93ec2;
      for (sep_1 = (char *)0x0; pcVar3 = sep_1,
          pcVar11 = (char *)std::vector<char,_std::allocator<char>_>::size
                                      ((vector<char,_std::allocator<char>_> *)local_88),
          pcVar3 < pcVar11; sep_1 = sep_1 + 1) {
        pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_88,(size_type)sep_1);
        if (*pvVar12 == '\0') {
          element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ = 0;
          bVar6 = MatchResultListener::IsInterested(pMStack_30);
          if (bVar6) {
            pMVar13 = MatchResultListener::operator<<(pMStack_30,(char **)&mi);
            pMVar13 = MatchResultListener::operator<<(pMVar13,(char (*) [10])0x18bfa3);
            pMVar13 = MatchResultListener::operator<<(pMVar13,(unsigned_long *)&sep_1);
            MatchResultListener::operator<<(pMVar13,(char (*) [3])0x189f0c);
            ppMVar14 = std::
                       vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                       ::operator[]((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                                     *)(this + 8),(size_type)sep_1);
            pMVar1 = *ppMVar14;
            poVar15 = MatchResultListener::stream(pMStack_30);
            (*pMVar1->_vptr_MatcherDescriberInterface[2])(pMVar1,poVar15);
            mi = (long)"\",\n" + 1;
          }
        }
      }
    }
    FVar7 = match_flags(this);
    if ((FVar7 & Subset) != 0) {
      outer_sep = "where the following elements don\'t match any matchers:\n";
      ei = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
      if ((element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ & 1) == 0)
      {
        ei = (size_t)anon_var_dwarf_93f0c;
      }
      for (local_d0 = 0; uVar2 = local_d0,
          sVar16 = std::vector<char,_std::allocator<char>_>::size
                             ((vector<char,_std::allocator<char>_> *)local_68), uVar2 < sVar16;
          local_d0 = local_d0 + 1) {
        pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_68,local_d0);
        if (*pvVar12 == '\0') {
          element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ = 0;
          bVar6 = MatchResultListener::IsInterested(pMStack_30);
          if (bVar6) {
            pMVar13 = MatchResultListener::operator<<(pMStack_30,(char **)&ei);
            pMVar13 = MatchResultListener::operator<<(pMVar13,&outer_sep);
            pMVar13 = MatchResultListener::operator<<(pMVar13,(char (*) [10])0x18bd59);
            pMVar13 = MatchResultListener::operator<<(pMVar13,&local_d0);
            pMVar13 = MatchResultListener::operator<<(pMVar13,(char (*) [3])0x189f0c);
            x = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)matrix_local,local_d0);
            MatchResultListener::operator<<(pMVar13,x);
            outer_sep = ",\n";
            ei = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
          }
        }
      }
    }
    this_local._7_1_ =
         element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ & 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_88);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_68);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  if (matrix.LhsSize() == 0 && matrix.RhsSize() == 0) {
    return true;
  }

  const bool is_exact_match_with_size_discrepency =
      match_flags() == UnorderedMatcherRequire::ExactMatch &&
      matrix.LhsSize() != matrix.RhsSize();
  if (is_exact_match_with_size_discrepency) {
    // The element count doesn't match.  If the container is empty,
    // there's no need to explain anything as Google Mock already
    // prints the empty container. Otherwise we just need to show
    // how many elements there actually are.
    if (matrix.LhsSize() != 0 && listener->IsInterested()) {
      *listener << "which has " << Elements(matrix.LhsSize()) << "\n";
    }
  }

  bool result = !is_exact_match_with_size_discrepency;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}